

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::ArgMinNullFun::GetFunctions(void)

{
  vector<duckdb::LogicalType,_true> *__range2;
  AggregateFunctionSet *in_RDI;
  LogicalType *by_type;
  pointer by_type_00;
  vector<duckdb::LogicalType,_true> by_types;
  LogicalType local_30;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&by_types,INTEGER);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,int>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,BIGINT);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,long>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,DOUBLE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,double>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,VARCHAR);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::string_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,DATE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::date_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,TIMESTAMP);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,TIMESTAMP_TZ);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,BLOB);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::string_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  ArgMaxByTypes();
  for (by_type_00 = by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      by_type_00 !=
      by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish; by_type_00 = by_type_00 + 1) {
    AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>>(in_RDI,by_type_00);
  }
  LogicalType::LogicalType(&local_30,ANY);
  AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
            (in_RDI,&local_30);
  LogicalType::~LogicalType(&local_30);
  AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
            (in_RDI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMinNullFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<LessThan, false, OrderType::ASCENDING>(fun);
	return fun;
}